

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O0

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
duckdb::LogicalTopN::Deserialize(Deserializer *deserializer)

{
  vector<duckdb::BoundOrderByNode,_true> *orders_00;
  Deserializer *in_RDI;
  unique_ptr<duckdb::LogicalTopN,_std::default_delete<duckdb::LogicalTopN>,_true> result;
  unsigned_long offset;
  unsigned_long limit;
  vector<duckdb::BoundOrderByNode,_true> orders;
  pointer in_stack_ffffffffffffff58;
  vector<duckdb::BoundOrderByNode,_true> *this;
  char *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  field_id_t field_id;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> limit_00;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar1;
  pointer in_stack_ffffffffffffff98;
  field_id_t in_stack_ffffffffffffffa6;
  Deserializer *in_stack_ffffffffffffffa8;
  
  field_id = (field_id_t)((ulong)in_stack_ffffffffffffff70 >> 0x30);
  limit_00._M_head_impl = (LogicalOperator *)in_RDI;
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::BoundOrderByNode,true>>
            (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa6,(char *)in_stack_ffffffffffffff98);
  orders_00 = (vector<duckdb::BoundOrderByNode,_true> *)
              Deserializer::ReadPropertyWithDefault<unsigned_long>
                        (in_RDI,field_id,in_stack_ffffffffffffff68);
  Deserializer::ReadPropertyWithDefault<unsigned_long>(in_RDI,field_id,in_stack_ffffffffffffff68);
  operator_new(0xa0);
  uVar1 = 1;
  this = (vector<duckdb::BoundOrderByNode,_true> *)&stack0xffffffffffffff98;
  vector<duckdb::BoundOrderByNode,_true>::vector
            (this,(vector<duckdb::BoundOrderByNode,_true> *)in_stack_ffffffffffffff58);
  LogicalTopN((LogicalTopN *)CONCAT17(uVar1,in_stack_ffffffffffffff90),orders_00,
              (idx_t)limit_00._M_head_impl,(idx_t)in_RDI);
  unique_ptr<duckdb::LogicalTopN,std::default_delete<duckdb::LogicalTopN>,true>::
  unique_ptr<std::default_delete<duckdb::LogicalTopN>,void>
            ((unique_ptr<duckdb::LogicalTopN,_std::default_delete<duckdb::LogicalTopN>,_true> *)this
             ,in_stack_ffffffffffffff58);
  vector<duckdb::BoundOrderByNode,_true>::~vector
            ((vector<duckdb::BoundOrderByNode,_true> *)0xad616f);
  unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>::
  unique_ptr<duckdb::LogicalTopN,std::default_delete<std::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>>>,void>
            ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)this,(unique_ptr<duckdb::LogicalTopN,_std::default_delete<duckdb::LogicalTopN>_> *)
                     in_stack_ffffffffffffff58);
  unique_ptr<duckdb::LogicalTopN,_std::default_delete<duckdb::LogicalTopN>,_true>::~unique_ptr
            ((unique_ptr<duckdb::LogicalTopN,_std::default_delete<duckdb::LogicalTopN>,_true> *)
             0xad6188);
  vector<duckdb::BoundOrderByNode,_true>::~vector
            ((vector<duckdb::BoundOrderByNode,_true> *)0xad6195);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )limit_00._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> LogicalTopN::Deserialize(Deserializer &deserializer) {
	auto orders = deserializer.ReadPropertyWithDefault<vector<BoundOrderByNode>>(200, "orders");
	auto limit = deserializer.ReadPropertyWithDefault<idx_t>(201, "limit");
	auto offset = deserializer.ReadPropertyWithDefault<idx_t>(202, "offset");
	auto result = duckdb::unique_ptr<LogicalTopN>(new LogicalTopN(std::move(orders), limit, offset));
	return std::move(result);
}